

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryCEscape
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,bool nulTerminate)

{
  EncodingResult<kj::Array<unsigned_char>_> *pEVar1;
  uint j;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  ArrayPtr<const_char16_t> utf16;
  ArrayPtr<const_char32_t> utf16_00;
  char c2;
  char c;
  undefined4 local_9c;
  uint value;
  uint uStack_94;
  uchar *puStack_90;
  ArrayDisposer *local_88;
  bool local_80;
  Vector<unsigned_char> result;
  ArrayPtr<unsigned_char> local_50;
  uint local_3c;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  
  pcVar4 = text.ptr;
  local_3c = (uint)text.size_;
  uVar3 = (ulong)local_3c;
  local_38 = __return_storage_ptr__;
  result.builder.ptr =
       _::HeapArrayDisposer::allocateUninitialized<unsigned_char>((size_t)(pcVar4 + uVar3));
  result.builder.endPtr = (uchar *)(pcVar4 + uVar3 + (long)result.builder.ptr);
  result.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar10 = (char *)0x0;
  result.builder.pos = result.builder.ptr;
  bVar11 = false;
  do {
    while( true ) {
      do {
        while( true ) {
          bVar5 = bVar11;
          pcVar9 = pcVar10;
          if (pcVar4 <= pcVar9) {
            if ((char)local_3c != '\0') {
              _value = (uchar *)((ulong)uStack_94 << 0x20);
              Vector<unsigned_char>::add<int>(&result,(int *)&value);
            }
            Vector<unsigned_char>::releaseAsArray((Array<unsigned_char> *)&value,&result);
            pEVar1 = local_38;
            (local_38->super_Array<unsigned_char>).ptr = _value;
            (local_38->super_Array<unsigned_char>).size_ = (size_t)puStack_90;
            (local_38->super_Array<unsigned_char>).disposer = local_88;
            _value = (uchar *)0x0;
            puStack_90 = (uchar *)0x0;
            local_38->hadErrors = bVar5;
            Array<unsigned_char>::~Array((Array<unsigned_char> *)&value);
            ArrayBuilder<unsigned_char>::dispose(&result.builder);
            return pEVar1;
          }
          c = *(char *)(this + (long)pcVar9);
          if ((kj)c == (kj)0x5c) break;
          Vector<unsigned_char>::add<char&>(&result,&c);
          pcVar10 = pcVar9 + 1;
          bVar11 = bVar5;
        }
        pcVar10 = pcVar4;
        bVar11 = true;
      } while (pcVar9 + 1 == pcVar4);
      c2 = *(char *)(this + 1 + (long)pcVar9);
      pcVar10 = pcVar9 + 2;
      uVar7 = (byte)c2 - 0x30;
      if (uVar7 < 8) break;
      uVar3 = (ulong)((byte)c2 - 0x6e);
      switch(uVar3) {
      case 0:
        _value = (uchar *)CONCAT71(stack0xffffffffffffff69,10);
        Vector<unsigned_char>::add<char>(&result,(char *)&value);
        bVar11 = bVar5;
        break;
      case 1:
      case 2:
      case 3:
      case 5:
      case 9:
switchD_003ae411_caseD_6f:
        Vector<unsigned_char>::add<char&>(&result,&c2);
        bVar11 = bVar5;
        break;
      case 4:
        _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0xd);
        Vector<unsigned_char>::add<char>(&result,(char *)&value);
        bVar11 = bVar5;
        break;
      case 6:
        _value = (uchar *)CONCAT71(stack0xffffffffffffff69,9);
        Vector<unsigned_char>::add<char>(&result,(char *)&value);
        bVar11 = bVar5;
        break;
      case 7:
        uVar7 = 0;
        iVar8 = 4;
        while( true ) {
          bVar11 = iVar8 == 0;
          iVar8 = iVar8 + -1;
          if (bVar11) break;
          if (pcVar4 == pcVar10) {
            bVar5 = true;
            pcVar10 = pcVar4;
            break;
          }
          anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&value,(char)this[(long)pcVar10]);
          if ((char)value != '\x01') {
            bVar5 = true;
            goto LAB_003ae5e1;
          }
          uVar7 = uVar7 << 4 | uStack_94;
          pcVar10 = pcVar10 + 1;
        }
LAB_003ae5e1:
        local_9c = CONCAT22(local_9c._2_2_,(short)uVar7);
        utf16.size_ = uVar3;
        utf16.ptr = (char16_t *)0x1;
        decodeUtf16((EncodingResult<kj::String> *)&value,(kj *)&local_9c,utf16);
        cVar6 = local_80;
        local_50.ptr = puStack_90;
        if (puStack_90 != (uchar *)0x0) {
          local_50.ptr = _value;
        }
        local_50.size_ = (size_t)(uchar *)0x0;
        if (puStack_90 != (uchar *)0x0) {
          local_50.size_ = (size_t)(puStack_90 + -1);
        }
        Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char>>(&result,&local_50);
LAB_003ae696:
        if (cVar6 != '\0') {
          bVar5 = true;
        }
        Array<char>::~Array((Array<char> *)&value);
        bVar11 = bVar5;
        break;
      case 8:
        _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0xb);
        Vector<unsigned_char>::add<char>(&result,(char *)&value);
        bVar11 = bVar5;
        break;
      case 10:
        uVar7 = 0;
        for (; pcVar10 < pcVar4; pcVar10 = pcVar10 + 1) {
          anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&value,(char)this[(long)pcVar10]);
          if ((char)value != '\x01') break;
          uVar7 = uVar7 << 4 | uStack_94;
        }
        local_50.ptr = (uchar *)CONCAT44(local_50.ptr._4_4_,uVar7);
        Vector<unsigned_char>::add<unsigned_int&>(&result,(uint *)&local_50);
        goto LAB_003ae3ea;
      default:
        if ((kj)c2 == (kj)0x22) {
          _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0x22);
          Vector<unsigned_char>::add<char>(&result,(char *)&value);
          bVar11 = bVar5;
        }
        else if ((kj)c2 == (kj)0x27) {
          _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0x27);
          Vector<unsigned_char>::add<char>(&result,(char *)&value);
          bVar11 = bVar5;
        }
        else {
          if ((kj)c2 == (kj)0x55) {
            uVar7 = 0;
            iVar8 = 8;
            while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
              if (pcVar4 == pcVar10) {
                bVar5 = true;
                pcVar10 = pcVar4;
                break;
              }
              anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&value,(char)this[(long)pcVar10]);
              if ((char)value != '\x01') {
                bVar5 = true;
                break;
              }
              uVar7 = uVar7 << 4 | uStack_94;
              pcVar10 = pcVar10 + 1;
            }
            utf16_00.size_ = uVar3;
            utf16_00.ptr = (char32_t *)0x1;
            local_9c = uVar7;
            decodeUtf32((EncodingResult<kj::String> *)&value,(kj *)&local_9c,utf16_00);
            cVar6 = local_80;
            local_50.ptr = puStack_90;
            if (puStack_90 != (uchar *)0x0) {
              local_50.ptr = _value;
            }
            local_50.size_ = (size_t)(uchar *)0x0;
            if (puStack_90 != (uchar *)0x0) {
              local_50.size_ = (size_t)(puStack_90 + -1);
            }
            Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char>>(&result,&local_50);
            goto LAB_003ae696;
          }
          if ((kj)c2 == (kj)0x5c) {
            _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0x5c);
            Vector<unsigned_char>::add<char>(&result,(char *)&value);
            bVar11 = bVar5;
          }
          else if ((kj)c2 == (kj)0x61) {
            _value = (uchar *)CONCAT71(stack0xffffffffffffff69,7);
            Vector<unsigned_char>::add<char>(&result,(char *)&value);
            bVar11 = bVar5;
          }
          else if ((kj)c2 == (kj)0x62) {
            _value = (uchar *)CONCAT71(stack0xffffffffffffff69,8);
            Vector<unsigned_char>::add<char>(&result,(char *)&value);
            bVar11 = bVar5;
          }
          else {
            if ((kj)c2 != (kj)0x66) goto switchD_003ae411_caseD_6f;
            _value = (uchar *)CONCAT71(stack0xffffffffffffff69,0xc);
            Vector<unsigned_char>::add<char>(&result,(char *)&value);
            bVar11 = bVar5;
          }
        }
      }
    }
    _value = (uchar *)CONCAT44(uStack_94,uVar7);
    uVar2 = 0;
    for (; ((uVar2 < 2 && (pcVar10 < pcVar4)) && (((byte)this[(long)pcVar10] & 0xf8) == 0x30));
        pcVar10 = pcVar10 + 1) {
      uVar7 = ((uint)(byte)this[(long)pcVar10] + uVar7 * 8) - 0x30;
      _value = (uchar *)CONCAT44(uStack_94,uVar7);
      uVar2 = uVar2 + 1;
    }
    Vector<unsigned_char>::add<unsigned_int&>(&result,&value);
LAB_003ae3ea:
    bVar11 = bVar5;
    if (0xff < uVar7) {
      bVar11 = true;
    }
  } while( true );
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryCEscape(ArrayPtr<const char> text, bool nulTerminate) {
  Vector<byte> result(text.size() + nulTerminate);
  bool hadErrors = false;

  size_t i = 0;
  while (i < text.size()) {
    char c = text[i++];
    if (c == '\\') {
      if (i == text.size()) {
        hadErrors = true;
        continue;
      }
      char c2 = text[i++];
      switch (c2) {
        case 'a' : result.add('\a'); break;
        case 'b' : result.add('\b'); break;
        case 'f' : result.add('\f'); break;
        case 'n' : result.add('\n'); break;
        case 'r' : result.add('\r'); break;
        case 't' : result.add('\t'); break;
        case 'v' : result.add('\v'); break;
        case '\'': result.add('\''); break;
        case '\"': result.add('\"'); break;
        case '\\': result.add('\\'); break;

        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7': {
          uint value = c2 - '0';
          for (uint j = 0; j < 2 && i < text.size(); j++) {
            KJ_IF_SOME(d, tryFromOctDigit(text[i])) {
              ++i;
              value = (value << 3) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'x': {
          uint value = 0;
          while (i < text.size()) {
            KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'u': {
          char16_t value = 0;
          for (uint j = 0; j < 4; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf16(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }

        case 'U': {
          char32_t value = 0;
          for (uint j = 0; j < 8; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf32(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }